

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

bool duckdb::ShouldRenderWhitespace(RenderTree *root,idx_t x,idx_t y)

{
  bool bVar1;
  optional_ptr<duckdb::RenderTreeNode,_true> oVar2;
  ulong uVar3;
  idx_t x_00;
  optional_ptr<duckdb::RenderTreeNode,_true> local_38;
  
  oVar2 = RenderTree::GetNode(root,x,y);
  local_38 = oVar2;
  bVar1 = RenderTree::HasNode(root,x,y + 1);
  uVar3 = (ulong)bVar1;
  if (oVar2.ptr == (RenderTreeNode *)0x0) {
    x_00 = x - 1;
    do {
      if (x_00 == 0xffffffffffffffff) {
        return false;
      }
      oVar2 = RenderTree::GetNode(root,x_00,y);
      local_38 = oVar2;
      bVar1 = RenderTree::HasNode(root,x_00,y + 1);
      uVar3 = uVar3 + bVar1;
      x_00 = x_00 - 1;
    } while (oVar2.ptr == (RenderTreeNode *)0x0);
  }
  optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_38);
  if ((0x10 < (ulong)((long)((local_38.ptr)->child_positions).
                            super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                            .
                            super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((local_38.ptr)->child_positions).
                           super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           .
                           super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           ._M_impl.super__Vector_impl_data._M_start)) &&
     (optional_ptr<duckdb::RenderTreeNode,_true>::CheckValid(&local_38),
     uVar3 < (ulong)((long)((local_38.ptr)->child_positions).
                           super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           .
                           super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)((local_38.ptr)->child_positions).
                           super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           .
                           super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4))) {
    return true;
  }
  return false;
}

Assistant:

static bool ShouldRenderWhitespace(RenderTree &root, idx_t x, idx_t y) {
	idx_t found_children = 0;
	for (;; x--) {
		auto node = root.GetNode(x, y);
		if (root.HasNode(x, y + 1)) {
			found_children++;
		}
		if (node) {
			if (NodeHasMultipleChildren(*node)) {
				if (found_children < node->child_positions.size()) {
					return true;
				}
			}
			return false;
		}
		if (x == 0) {
			break;
		}
	}
	return false;
}